

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O3

Belief * __thiscall despot::BaseTag::Tau(BaseTag *this,Belief *belief,ACT_TYPE action,OBS_TYPE obs)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  ParticleBelief *pPVar4;
  long lVar5;
  int i;
  long lVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  vector<despot::State_*,_std::allocator<despot::State_*>_> new_particles;
  State *new_particle;
  double local_b0;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_98;
  long local_80;
  long *local_78;
  ulong local_70;
  OBS_TYPE local_68;
  long local_60;
  double local_58;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_50;
  State *local_38;
  
  local_68 = obs;
  if ((Tau(despot::Belief_const*,int,unsigned_long)::probs == '\0') &&
     (iVar3 = __cxa_guard_acquire(&Tau(despot::Belief_const*,int,unsigned_long)::probs), iVar3 != 0)
     ) {
    iVar3 = (**(code **)(*(long *)this + 0x10))(this);
    std::vector<double,_std::allocator<double>_>::vector
              (&Tau::probs,(long)iVar3,(allocator_type *)&local_98);
    __cxa_atexit(std::vector<double,_std::allocator<double>_>::~vector,&Tau::probs,&__dso_handle);
    __cxa_guard_release(&Tau(despot::Belief_const*,int,unsigned_long)::probs);
  }
  local_78 = (long *)(**(code **)(*(long *)belief + 0x30))(belief);
  lVar6 = *local_78;
  local_b0 = 0.0;
  if (local_78[1] != lVar6) {
    local_b0 = 0.0;
    uVar8 = 0;
    local_80 = (long)action * 3;
    do {
      lVar2 = local_80;
      lVar6 = *(long *)(lVar6 + uVar8 * 8);
      local_70 = uVar8;
      iVar3 = (**(code **)(*(long *)this + 0x58))(this,lVar6);
      lVar7 = *(long *)&(this->transition_probabilities_).
                        super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar3].
                        super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                        ._M_impl.super__Vector_impl_data;
      lVar5 = *(long *)(lVar7 + lVar2 * 8);
      if (*(long *)(lVar7 + 8 + lVar2 * 8) != lVar5) {
        plVar1 = (long *)(lVar7 + lVar2 * 8);
        lVar7 = 0xc;
        uVar8 = 0;
        local_60 = lVar6;
        do {
          local_58 = *(double *)(local_60 + 0x18) * *(double *)(lVar5 + 0xc + lVar7);
          dVar9 = (double)(**(code **)(*(long *)this + 0x68))
                                    (this,local_68,
                                     (this->states_).
                                     super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start
                                     [*(int *)(lVar5 + lVar7)],action);
          local_b0 = local_b0 + dVar9 * local_58;
          Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[*(int *)(lVar5 + lVar7)] =
               dVar9 * local_58 +
               Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[*(int *)(lVar5 + lVar7)];
          uVar8 = uVar8 + 1;
          lVar5 = *plVar1;
          lVar7 = lVar7 + 0x20;
        } while (uVar8 < (ulong)(plVar1[1] - lVar5 >> 5));
      }
      uVar8 = local_70 + 1;
      lVar6 = *local_78;
    } while (uVar8 < (ulong)(local_78[1] - lVar6 >> 3));
  }
  local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (State **)0x0;
  local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (State **)0x0;
  for (lVar6 = 0; iVar3 = (**(code **)(*(long *)this + 0x10))(this), lVar6 < iVar3;
      lVar6 = lVar6 + 1) {
    if (0.0 < Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar6]) {
      local_38 = (State *)(**(code **)(*(long *)this + 0xe8))
                                    (this,(this->states_).
                                          super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar6]);
      *(double *)(local_38 + 0x18) =
           Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar6] / local_b0;
      if (local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<despot::State*,std::allocator<despot::State*>>::
        _M_realloc_insert<despot::State*const&>
                  ((vector<despot::State*,std::allocator<despot::State*>> *)&local_98,
                   (iterator)
                   local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_38);
      }
      else {
        *local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
         super__Vector_impl_data._M_finish = local_38;
        local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar6] = 0.0;
    }
  }
  pPVar4 = (ParticleBelief *)operator_new(0x90);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(&local_50,&local_98);
  despot::ParticleBelief::ParticleBelief(pPVar4,&local_50,&this->super_BeliefMDP,0,0);
  if (local_50.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (Belief *)pPVar4;
}

Assistant:

Belief* BaseTag::Tau(const Belief* belief, ACT_TYPE action, OBS_TYPE obs) const {
	static vector<double> probs = vector<double>(NumStates());

	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();

	double sum = 0;
	for (int i = 0; i < particles.size(); i++) {
		TagState* state = static_cast<TagState*>(particles[i]);
		const vector<State>& distribution = transition_probabilities_[GetIndex(
			state)][action];
		for (int j = 0; j < distribution.size(); j++) {
			const State& next = distribution[j];
			double p = state->weight * next.weight
				* ObsProb(obs, *(states_[next.state_id]), action);
			probs[next.state_id] += p;
			sum += p;
		}
	}

	vector<State*> new_particles;
	for (int i = 0; i < NumStates(); i++) {
		if (probs[i] > 0) {
			State* new_particle = Copy(states_[i]);
			new_particle->weight = probs[i] / sum;
			new_particles.push_back(new_particle);
			probs[i] = 0;
		}
	}

	return new ParticleBelief(new_particles, this, NULL, false);
}